

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O3

void share_got_pkt_from_server(ssh_sharing_connstate *cs,int type,void *vpkt,int pktlen)

{
  uint uVar1;
  tree234 *t;
  share_globreq *ptr;
  ConnectionLayer *pCVar2;
  unsigned_long uVar3;
  share_channel *chan;
  uint *__dest;
  share_xchannel *xc;
  share_xchannel_message *psVar4;
  undefined4 *e;
  undefined4 *puVar5;
  share_xchannel_message *psVar6;
  uint8_t *p;
  size_t addend;
  share_forwarding *e_00;
  BinarySource src [1];
  BinarySource local_98;
  undefined4 local_68;
  undefined4 local_64;
  
  addend = (size_t)pktlen;
  local_98.binarysource_ = &local_98;
  local_98.pos = 0;
  local_98.err = BSE_NO_ERROR;
  local_98.data = vpkt;
  local_98.len = addend;
  if (type - 0x5bU < 10) {
    uVar3 = BinarySource_get_uint32(&local_98);
    local_64 = (int)uVar3;
    chan = (share_channel *)find234(cs->channels_by_us,&local_68,(cmpfn234)0x0);
    if (chan == (share_channel *)0x0) {
      local_68 = (int)uVar3;
      xc = (share_xchannel *)find234(cs->xchannels_by_us,&local_68,(cmpfn234)0x0);
      if (xc == (share_xchannel *)0x0) {
        return;
      }
      psVar4 = (share_xchannel_message *)safemalloc(1,0x20,addend);
      psVar4->data = (uchar *)(psVar4 + 1);
      psVar4->datalen = pktlen;
      psVar4->type = type;
      memcpy(psVar4 + 1,vpkt,addend);
      psVar6 = (share_xchannel_message *)&xc->msghead;
      if (xc->msgtail != (share_xchannel_message *)0x0) {
        psVar6 = xc->msgtail;
      }
      psVar6->next = psVar4;
      psVar4->next = (share_xchannel_message *)0x0;
      xc->msgtail = psVar4;
      if (xc->live != false) {
        return;
      }
      share_dead_xchannel_respond(cs,xc);
      return;
    }
    __dest = (uint *)safemalloc(addend,1,0);
    memcpy(__dest,vpkt,addend);
    uVar1 = chan->downstream_id;
    *__dest = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    send_packet_to_downstream(cs,type,__dest,pktlen,chan);
    safefree(__dest);
    if (type == 0x61) {
      if (chan->state != 1) {
        chan->state = 2;
        return;
      }
      pCVar2 = cs->parent->cl;
      (*pCVar2->vt->delete_sharing_channel)(pCVar2,chan->upstream_id);
      share_remove_channel(cs,chan);
    }
    else {
      if (type == 0x5c) {
        pCVar2 = cs->parent->cl;
        (*pCVar2->vt->delete_sharing_channel)(pCVar2,chan->upstream_id);
        share_remove_channel(cs,chan);
        return;
      }
      if (type != 0x5b) {
        return;
      }
      if (pktlen < 8) {
        return;
      }
      if (chan->state != 3) {
        return;
      }
      uVar1 = *(uint *)((long)vpkt + 4);
      t = cs->channels_by_server;
      chan->server_id =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      chan->state = 0;
      add234(t,chan);
    }
    goto LAB_00136816;
  }
  if (1 < type - 0x51U) {
    if (type != 0x5a) {
      __assert_fail("false && \"This packet type should never have come from \" \"connection2.c\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c"
                    ,0x50d,
                    "void share_got_pkt_from_server(ssh_sharing_connstate *, int, const void *, int)"
                   );
    }
    BinarySource_get_string(&local_98);
    uVar3 = BinarySource_get_uint32(local_98.binarysource_);
    if ((local_98.binarysource_)->err == BSE_NO_ERROR) {
      e = (undefined4 *)safemalloc(1,4,0);
      *e = (int)uVar3;
      puVar5 = (undefined4 *)add234(cs->halfchannels,e);
      if (puVar5 != e) {
        safefree(e);
      }
      send_packet_to_downstream(cs,0x5a,vpkt,pktlen,(share_channel *)0x0);
      return;
    }
    __assert_fail("!get_err(src)",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c",
                  0x4bb,
                  "void share_got_pkt_from_server(ssh_sharing_connstate *, int, const void *, int)")
    ;
  }
  ptr = cs->globreq_head;
  if (ptr == (share_globreq *)0x0) {
    __assert_fail("globreq",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c",
                  0x49c,
                  "void share_got_pkt_from_server(ssh_sharing_connstate *, int, const void *, int)")
    ;
  }
  if (ptr->type == 0) {
    e_00 = ptr->fwd;
    if (type == 0x52) goto LAB_001367b5;
    e_00->active = true;
  }
  else if (type == 0x51 && ptr->type == 1) {
    e_00 = ptr->fwd;
LAB_001367b5:
    del234(cs->forwardings,e_00);
    safefree(e_00);
  }
  if (ptr->want_reply == true) {
    send_packet_to_downstream(cs,type,vpkt,pktlen,(share_channel *)0x0);
  }
  cs->globreq_head = ptr->next;
  safefree(ptr);
  if (cs->globreq_head == (share_globreq *)0x0) {
    cs->globreq_tail = (share_globreq *)0x0;
  }
LAB_00136816:
  if (cs->sock == (Socket *)0x0) {
    share_try_cleanup(cs);
  }
  return;
}

Assistant:

void share_got_pkt_from_server(ssh_sharing_connstate *cs, int type,
                               const void *vpkt, int pktlen)
{
    const unsigned char *pkt = (const unsigned char *)vpkt;
    struct share_globreq *globreq;
    size_t id_pos;
    unsigned upstream_id, server_id;
    struct share_channel *chan;
    struct share_xchannel *xc;
    BinarySource src[1];

    BinarySource_BARE_INIT(src, pkt, pktlen);

    switch (type) {
      case SSH2_MSG_REQUEST_SUCCESS:
      case SSH2_MSG_REQUEST_FAILURE:
        globreq = cs->globreq_head;
        assert(globreq);         /* should match the queue in connection2.c */
        if (globreq->type == GLOBREQ_TCPIP_FORWARD) {
            if (type == SSH2_MSG_REQUEST_FAILURE) {
                share_remove_forwarding(cs, globreq->fwd);
            } else {
                globreq->fwd->active = true;
            }
        } else if (globreq->type == GLOBREQ_CANCEL_TCPIP_FORWARD) {
            if (type == SSH2_MSG_REQUEST_SUCCESS) {
                share_remove_forwarding(cs, globreq->fwd);
            }
        }
        if (globreq->want_reply) {
            send_packet_to_downstream(cs, type, pkt, pktlen, NULL);
        }
        cs->globreq_head = globreq->next;
        sfree(globreq);
        if (cs->globreq_head == NULL)
            cs->globreq_tail = NULL;

        if (!cs->sock) {
            /* Retry cleaning up this connection, in case that reply
             * was the last thing we were waiting for. */
            share_try_cleanup(cs);
        }

        break;

      case SSH2_MSG_CHANNEL_OPEN:
        get_string(src);
        server_id = get_uint32(src);
        assert(!get_err(src));
        share_add_halfchannel(cs, server_id);

        send_packet_to_downstream(cs, type, pkt, pktlen, NULL);
        break;

      case SSH2_MSG_CHANNEL_OPEN_CONFIRMATION:
      case SSH2_MSG_CHANNEL_OPEN_FAILURE:
      case SSH2_MSG_CHANNEL_CLOSE:
      case SSH2_MSG_CHANNEL_WINDOW_ADJUST:
      case SSH2_MSG_CHANNEL_DATA:
      case SSH2_MSG_CHANNEL_EXTENDED_DATA:
      case SSH2_MSG_CHANNEL_EOF:
      case SSH2_MSG_CHANNEL_REQUEST:
      case SSH2_MSG_CHANNEL_SUCCESS:
      case SSH2_MSG_CHANNEL_FAILURE:
        /*
         * All these messages have the recipient channel id as the
         * first uint32 field in the packet. Substitute the downstream
         * channel id for our one and pass the packet downstream.
         */
        id_pos = src->pos;
        upstream_id = get_uint32(src);
        if ((chan = share_find_channel_by_upstream(cs, upstream_id)) != NULL) {
            /*
             * The normal case: this id refers to an open channel.
             */
            unsigned char *rewritten = snewn(pktlen, unsigned char);
            memcpy(rewritten, pkt, pktlen);
            PUT_32BIT_MSB_FIRST(rewritten + id_pos, chan->downstream_id);
            send_packet_to_downstream(cs, type, rewritten, pktlen, chan);
            sfree(rewritten);

            /*
             * Update the channel state, for messages that need it.
             */
            if (type == SSH2_MSG_CHANNEL_OPEN_CONFIRMATION) {
                if (chan->state == UNACKNOWLEDGED && pktlen >= 8) {
                    share_channel_set_server_id(
                        cs, chan, GET_32BIT_MSB_FIRST(pkt+4), OPEN);
                    if (!cs->sock) {
                        /* Retry cleaning up this connection, so that we
                         * can send an immediate CLOSE on this channel for
                         * which we now know the server id. */
                        share_try_cleanup(cs);
                    }
                }
            } else if (type == SSH2_MSG_CHANNEL_OPEN_FAILURE) {
                ssh_delete_sharing_channel(cs->parent->cl, chan->upstream_id);
                share_remove_channel(cs, chan);
            } else if (type == SSH2_MSG_CHANNEL_CLOSE) {
                if (chan->state == SENT_CLOSE) {
                    ssh_delete_sharing_channel(cs->parent->cl,
                                               chan->upstream_id);
                    share_remove_channel(cs, chan);
                    if (!cs->sock) {
                        /* Retry cleaning up this connection, in case this
                         * channel closure was the last thing we were
                         * waiting for. */
                        share_try_cleanup(cs);
                    }
                } else {
                    chan->state = RCVD_CLOSE;
                }
            }
        } else if ((xc = share_find_xchannel_by_upstream(cs, upstream_id))
                   != NULL) {
            /*
             * The unusual case: this id refers to an xchannel. Add it
             * to the xchannel's queue.
             */
            share_xchannel_add_message(xc, type, pkt, pktlen);

            /* If the xchannel is dead, then also respond to it (which
             * may involve deleting the channel). */
            if (!xc->live)
                share_dead_xchannel_respond(cs, xc);
        }
        break;

      default:
        unreachable("This packet type should never have come from "
                    "connection2.c");
    }
}